

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O0

int opn2_openFile(OPN2_MIDIPlayer *device,char *filePath)

{
  OPNMIDIplay *this;
  allocator local_49;
  string local_48;
  OPNMIDIplay *local_28;
  MidiPlayer *play;
  char *filePath_local;
  OPN2_MIDIPlayer *device_local;
  
  play = (MidiPlayer *)filePath;
  filePath_local = (char *)device;
  if (device == (OPN2_MIDIPlayer *)0x0) {
    std::__cxx11::string::operator=
              ((string *)&OPN2MIDI_ErrorString_abi_cxx11_,
               "Can\'t load file: OPN2 MIDI is not initialized");
  }
  else {
    this = (OPNMIDIplay *)device->opn2_midiPlayer;
    local_28 = this;
    if (this == (OPNMIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x20f,"int opn2_openFile(OPN2_MIDIPlayer *, const char *)");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,
               "OPNMIDI: MIDI Sequencer is not supported in this build of library!",&local_49);
    OPNMIDIplay::setErrorString(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return -1;
}

Assistant:

OPNMIDI_EXPORT int opn2_openFile(OPN2_MIDIPlayer *device, const char *filePath)
{
    if(device)
    {
        MidiPlayer *play = GET_MIDI_PLAYER(device);
        assert(play);
#ifndef OPNMIDI_DISABLE_MIDI_SEQUENCER
        play->m_setup.tick_skip_samples_delay = 0;
        if(!play->LoadMIDI(filePath))
        {
            std::string err = play->getErrorString();
            if(err.empty())
                play->setErrorString("OPN2 MIDI: Can't load file");
            return -1;
        }
        else return 0;
#else
        ADL_UNUSED(filePath);
        play->setErrorString("OPNMIDI: MIDI Sequencer is not supported in this build of library!");
        return -1;
#endif
    }

    OPN2MIDI_ErrorString = "Can't load file: OPN2 MIDI is not initialized";
    return -1;
}